

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::PeriodicDelaunay3dThread::show_tet_adjacent
          (PeriodicDelaunay3dThread *this,index_t t,index_t lf)

{
  bool bVar1;
  index_t t_00;
  char local_29;
  signed_index_t adj;
  index_t lf_local;
  index_t t_local;
  PeriodicDelaunay3dThread *this_local;
  
  t_00 = tet_adjacent(this,t,lf);
  if (t_00 != 0xffffffff) {
    bVar1 = tet_is_in_list(this,t_00);
    local_29 = '*';
    if (!bVar1) {
      local_29 = ' ';
    }
    std::operator<<((ostream *)&std::cerr,local_29);
  }
  std::ostream::operator<<(&std::cerr,t_00);
  std::operator<<((ostream *)&std::cerr,' ');
  return;
}

Assistant:

void show_tet_adjacent(index_t t, index_t lf) const {
            signed_index_t adj = tet_adjacent(t, lf);
            if(adj != -1) {
                std::cerr << (tet_is_in_list(index_t(adj)) ? '*' : ' ');
            }
            std::cerr << adj;
            std::cerr << ' ';
        }